

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O2

void pool_destroy_all(void)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = prf_array_count(pools);
  for (uVar2 = 1; uVar2 < (uVar1 & 0xffff); uVar2 = uVar2 + 1) {
    if (pools[uVar2] != (pool_info_t)0x0) {
      pool_destroy((pool_t)uVar2);
    }
  }
  return;
}

Assistant:

void
pool_destroy_all(
    void )
{
    pool_t pool_id, num_pools;
    num_pools = prf_array_count( pools );
    for ( pool_id = 1; pool_id < num_pools; pool_id++ ) {
       if ( pools[ pool_id ] != NULL )
           pool_destroy( pool_id );
    }
}